

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O0

void __thiscall
TEST_FailableMemoryAllocator_CheckAllFailingAllocsWereDone_Test::testBody
          (TEST_FailableMemoryAllocator_CheckAllFailingAllocsWereDone_Test *this)

{
  UtestShell *pUVar1;
  size_t sVar2;
  TestTerminator *pTVar3;
  SimpleString local_20;
  TEST_FailableMemoryAllocator_CheckAllFailingAllocsWereDone_Test *local_10;
  TEST_FailableMemoryAllocator_CheckAllFailingAllocsWereDone_Test *this_local;
  
  (this->super_TEST_GROUP_CppUTestGroupFailableMemoryAllocator).testFunction.testFunction_ =
       failingAllocIsNeverDone_;
  local_10 = this;
  TestTestingFixture::runAllTests
            (&(this->super_TEST_GROUP_CppUTestGroupFailableMemoryAllocator).fixture);
  pUVar1 = UtestShell::getCurrent();
  sVar2 = TestTestingFixture::getFailureCount
                    (&(this->super_TEST_GROUP_CppUTestGroupFailableMemoryAllocator).fixture);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0xe])
            (pUVar1,1,sVar2,"LONGS_EQUAL(1, fixture.getFailureCount()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
             ,0x118,pTVar3);
  SimpleString::SimpleString(&local_20,"Expected allocation number 3 was never done");
  TestTestingFixture::assertPrintContains
            (&(this->super_TEST_GROUP_CppUTestGroupFailableMemoryAllocator).fixture,&local_20);
  SimpleString::~SimpleString(&local_20);
  (*(((this->super_TEST_GROUP_CppUTestGroupFailableMemoryAllocator).failableMallocAllocator)->
    super_TestMemoryAllocator)._vptr_TestMemoryAllocator[0xe])();
  return;
}

Assistant:

TEST(FailableMemoryAllocator, CheckAllFailingAllocsWereDone)
{
    testFunction.testFunction_ = failingAllocIsNeverDone_;

    fixture.runAllTests();

    LONGS_EQUAL(1, fixture.getFailureCount());
    fixture.assertPrintContains("Expected allocation number 3 was never done");
    failableMallocAllocator->clearFailedAllocs();
}